

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

string * cmQtAutoGen::AppendFilenameSuffix
                   (string *__return_storage_ptr__,string *filename,string *suffix)

{
  pointer pcVar1;
  long lVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar2 = std::__cxx11::string::rfind((char)filename,0x2e);
  if (lVar2 == -1) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(suffix->_M_dataplus)._M_p);
  }
  else {
    pcVar1 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)pcVar1);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(suffix->_M_dataplus)._M_p);
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
               (ulong)(pcVar1 + lVar2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::AppendFilenameSuffix(std::string const& filename,
                                              std::string const& suffix)
{
  std::string res;
  auto pos = filename.rfind('.');
  if (pos != std::string::npos) {
    const auto it_dot = filename.begin() + pos;
    res.assign(filename.begin(), it_dot);
    res.append(suffix);
    res.append(it_dot, filename.end());
  } else {
    res = filename;
    res.append(suffix);
  }
  return res;
}